

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstral_analysis.cc
# Opt level: O3

bool __thiscall
sptk::MelCepstralAnalysis::Run
          (MelCepstralAnalysis *this,vector<double,_std::allocator<double>_> *periodogram,
          vector<double,_std::allocator<double>_> *mel_cepstrum,Buffer *buffer)

{
  uint uVar1;
  size_type __new_size;
  vector<double,_std::allocator<double>_> *pvVar2;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *real_part_output;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<double,_std::allocator<double>_> *this_03;
  vector<double,_std::allocator<double>_> *this_04;
  vector<double,_std::allocator<double>_> *real_part_output_00;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  pointer pdVar9;
  double *pdVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  size_type __new_size_00;
  size_t __n;
  double *pdVar15;
  size_type __new_size_01;
  pointer pdVar16;
  pointer pdVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double local_e8;
  value_type_conflict local_50;
  double local_48;
  undefined8 uStack_40;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if ((buffer != (Buffer *)0x0) && (mel_cepstrum != (vector<double,_std::allocator<double>_> *)0x0))
  {
    uVar3 = this->fft_length_;
    lVar12 = (long)(periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    __new_size_00 = lVar12 >> 3;
    uVar1 = (int)uVar3 / 2 + 1;
    if (__new_size_00 == (long)(int)uVar1) {
      iVar4 = this->num_order_;
      lVar8 = (long)iVar4;
      __new_size = lVar8 + 1;
      if ((long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(mel_cepstrum,__new_size);
      }
      pvVar2 = &buffer->log_periodogram_;
      if ((long)(buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start != lVar12) {
        std::vector<double,_std::allocator<double>_>::resize(pvVar2,__new_size_00);
      }
      this_00 = &buffer->cepstrum_;
      if ((long)(buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)this->fft_length_) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->fft_length_);
      }
      this_01 = &buffer->rt_;
      iVar11 = (int)__new_size * 2 + -1;
      __new_size_01 = (size_type)iVar11;
      if ((long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size_01) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size_01);
      }
      this_02 = &buffer->rr_;
      if ((long)(buffer->rr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->rr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size_01) {
        std::vector<double,_std::allocator<double>_>::resize(this_02,__new_size_01);
      }
      this_03 = &buffer->ra_;
      if ((long)(buffer->ra_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->ra_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_03,__new_size);
      }
      this_04 = &buffer->gradient_;
      if ((long)(buffer->gradient_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->gradient_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_04,__new_size);
      }
      pdVar10 = (periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar5 = (periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar17 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (pdVar10 != pdVar5) {
        do {
          dVar20 = log(*pdVar10);
          *pdVar17 = dVar20;
          pdVar10 = pdVar10 + 1;
          pdVar17 = pdVar17 + 1;
        } while (pdVar10 != pdVar5);
        pdVar17 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pdVar9 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pdVar16 = (buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((long)pdVar9 - (long)pdVar17 != 0) {
        memmove(pdVar16,pdVar17,(long)pdVar9 - (long)pdVar17);
        pdVar17 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar9 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pdVar16 = (buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pdVar9 = pdVar9 + -1;
      lVar18 = (long)((int)uVar3 / 2);
      if (pdVar9 != pdVar17 + 1) {
        pdVar10 = pdVar16 + lVar18;
        do {
          pdVar10 = pdVar10 + 1;
          pdVar16 = pdVar9 + -1;
          pdVar9 = pdVar9 + -1;
          *pdVar10 = *pdVar16;
        } while (pdVar9 != pdVar17 + 1);
      }
      pvVar2 = &buffer->imag_part_output_;
      bVar6 = RealValuedInverseFastFourierTransform::Run
                        (&this->inverse_fourier_transform_,this_00,this_00,pvVar2,
                         &buffer->buffer_for_inverse_fourier_transform_);
      if (bVar6) {
        pdVar10 = (buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        *pdVar10 = *pdVar10 * 0.5;
        pdVar10[lVar18] = pdVar10[lVar18] * 0.5;
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size_00);
        bVar6 = FrequencyTransform::Run
                          (&this->frequency_transform_,this_00,mel_cepstrum,
                           &buffer->buffer_for_frequency_transform_);
        if (bVar6) {
          if (this->num_iteration_ < 1) {
            return true;
          }
          real_part_output = &buffer->d_;
          real_part_output_00 = &buffer->r_;
          local_e8 = 1.79769313486232e+308;
          iVar7 = 0;
          do {
            std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size_00);
            bVar6 = FrequencyTransform::Run
                              (&this->inverse_frequency_transform_,mel_cepstrum,this_00,
                               &buffer->buffer_for_inverse_frequency_transform_);
            if (!bVar6) {
              return false;
            }
            local_50 = 0.0;
            std::vector<double,_std::allocator<double>_>::resize
                      (this_00,(long)this->fft_length_,&local_50);
            bVar6 = RealValuedFastFourierTransform::Run
                              (&this->fourier_transform_,this_00,real_part_output,pvVar2,
                               &buffer->buffer_for_fourier_transform_);
            if (!bVar6) {
              return false;
            }
            pdVar10 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar5 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pdVar15 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (pdVar10 != pdVar5) {
              do {
                dVar20 = exp((*pdVar10 - *pdVar15) - *pdVar15);
                *pdVar15 = dVar20;
                pdVar10 = pdVar10 + 1;
                pdVar15 = pdVar15 + 1;
              } while (pdVar10 != pdVar5);
              pdVar15 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            }
            if ((uVar3 & 0xfffffffe) != 2) {
              pdVar10 = pdVar15 + lVar18 + 1;
              lVar13 = lVar18 * 8 + -8;
              do {
                *pdVar10 = *(double *)((long)pdVar15 + lVar13);
                pdVar10 = pdVar10 + 1;
                lVar13 = lVar13 + -8;
              } while (lVar13 != 0);
            }
            bVar6 = RealValuedInverseFastFourierTransform::Run
                              (&this->inverse_fourier_transform_,real_part_output,
                               real_part_output_00,pvVar2,
                               &buffer->buffer_for_inverse_fourier_transform_);
            if (!bVar6) {
              return false;
            }
            dVar20 = this->alpha_;
            if ((long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3 != __new_size_01) {
              std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size_01);
            }
            if ((dVar20 != 0.0) || (NAN(dVar20))) {
              pdVar10 = (buffer->b_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((long)(buffer->b_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar10 >> 3 != __new_size_01) {
                std::vector<double,_std::allocator<double>_>::resize(&buffer->b_,__new_size_01);
                pdVar10 = (buffer->b_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              pdVar17 = (real_part_output_00->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pdVar9 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              memset(pdVar9,0,__new_size_01 * 8);
              uVar19 = (ulong)uVar1;
              if (-2 < (int)uVar3) {
                do {
                  *pdVar10 = *pdVar9;
                  *pdVar9 = pdVar17[uVar19 - 1];
                  if (0 < iVar4) {
                    uVar14 = 0;
                    do {
                      dVar21 = pdVar9[uVar14 + 1];
                      pdVar10[uVar14 + 1] = dVar21;
                      pdVar9[uVar14 + 1] = (dVar21 - pdVar9[uVar14]) * dVar20 + pdVar10[uVar14];
                      uVar14 = uVar14 + 1;
                    } while ((uint)(iVar4 * 2) != uVar14);
                  }
                  bVar6 = 1 < (long)uVar19;
                  uVar19 = uVar19 - 1;
                } while (bVar6);
              }
            }
            else {
              pdVar17 = (real_part_output_00->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              if ((int)uVar1 < iVar11) {
                pdVar9 = (buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                __n = (long)(buffer->r_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_finish - (long)pdVar17;
                if (__n != 0) {
                  memmove(pdVar9,pdVar17,__n);
                  pdVar9 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                }
                pdVar17 = (buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (pdVar9 + __new_size_00 != pdVar17) {
                  memset(pdVar9 + __new_size_00,0,
                         (long)pdVar17 - ((long)pdVar9 + lVar12) & 0xfffffffffffffff8);
                }
              }
              else {
                memmove((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start,pdVar17,__new_size_01 * 8);
              }
            }
            pdVar10 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            local_48 = *pdVar10;
            dVar21 = ABS((local_48 - local_e8) / local_48);
            dVar20 = this->convergence_threshold_;
            if (dVar21 < dVar20) {
              return true;
            }
            uStack_40 = 0;
            pdVar17 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar13 = lVar8 * 8;
            pdVar9 = pdVar17;
            if (iVar4 == 0) {
LAB_00112a5d:
              memmove(pdVar17 + lVar8,pdVar10,__new_size * 8);
              pdVar17 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar9 = (this_03->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar16 = (this->alpha_vector_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              lVar13 = 0;
              do {
                *(double *)((long)pdVar9 + lVar13) =
                     *(double *)((long)pdVar17 + lVar13) - *(double *)((long)pdVar16 + lVar13);
                lVar13 = lVar13 + 8;
              } while (__new_size * 8 - lVar13 != 0);
            }
            else {
              do {
                *pdVar9 = *(double *)((long)pdVar10 + lVar13);
                lVar13 = lVar13 + -8;
                pdVar9 = pdVar9 + 1;
              } while (lVar13 != 0);
              if ((int)__new_size != 0) goto LAB_00112a5d;
            }
            bVar6 = ToeplitzPlusHankelSystemSolver::Run
                              (&this->toeplitz_plus_hankel_system_solver_,this_02,this_01,this_03,
                               this_04,&buffer->buffer_for_system_solver_);
            if (!bVar6) {
              return false;
            }
            pdVar10 = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar5 = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pdVar10 != pdVar5) {
              pdVar15 = (this_04->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                *pdVar10 = *pdVar10 + *pdVar15;
                pdVar10 = pdVar10 + 1;
                pdVar15 = pdVar15 + 1;
              } while (pdVar10 != pdVar5);
            }
            uVar19 = -(ulong)(dVar20 <= dVar21);
            local_e8 = (double)(~uVar19 & (ulong)local_e8 | (ulong)local_48 & uVar19);
            iVar7 = iVar7 + 1;
            if (this->num_iteration_ <= iVar7) {
              return true;
            }
          } while( true );
        }
      }
    }
  }
  return false;
}

Assistant:

bool MelCepstralAnalysis::Run(const std::vector<double>& periodogram,
                              std::vector<double>* mel_cepstrum,
                              MelCepstralAnalysis::Buffer* buffer) const {
  // Check inputs.
  const int half_fft_length(fft_length_ / 2);
  if (!is_valid_ ||
      periodogram.size() != static_cast<std::size_t>(half_fft_length + 1) ||
      NULL == mel_cepstrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int length(num_order_ + 1);
  if (mel_cepstrum->size() != static_cast<std::size_t>(length)) {
    mel_cepstrum->resize(length);
  }
  if (buffer->log_periodogram_.size() !=
      static_cast<std::size_t>(half_fft_length + 1)) {
    buffer->log_periodogram_.resize(half_fft_length + 1);
  }
  if (buffer->cepstrum_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->cepstrum_.resize(fft_length_);
  }
  if (buffer->rt_.size() != static_cast<std::size_t>(2 * length - 1)) {
    buffer->rt_.resize(2 * length - 1);
  }
  if (buffer->rr_.size() != static_cast<std::size_t>(2 * length - 1)) {
    buffer->rr_.resize(2 * length - 1);
  }
  if (buffer->ra_.size() != static_cast<std::size_t>(length)) {
    buffer->ra_.resize(length);
  }
  if (buffer->gradient_.size() != static_cast<std::size_t>(length)) {
    buffer->gradient_.resize(length);
  }

  // Make an initial guess.
  {
    std::transform(periodogram.begin(), periodogram.end(),
                   buffer->log_periodogram_.begin(),
                   [](double p) { return std::log(p); });

    // \log I_N -> c
    std::copy(buffer->log_periodogram_.begin(), buffer->log_periodogram_.end(),
              buffer->cepstrum_.begin());
    std::reverse_copy(buffer->log_periodogram_.begin() + 1,
                      buffer->log_periodogram_.end() - 1,
                      buffer->cepstrum_.begin() + half_fft_length + 1);
    if (!inverse_fourier_transform_.Run(
            buffer->cepstrum_, &buffer->cepstrum_, &buffer->imag_part_output_,
            &buffer->buffer_for_inverse_fourier_transform_)) {
      return false;
    }
    buffer->cepstrum_[0] *= 0.5;
    buffer->cepstrum_[half_fft_length] *= 0.5;

    // c -> \tilde{c}
    buffer->cepstrum_.resize(half_fft_length + 1);
    if (!frequency_transform_.Run(buffer->cepstrum_, mel_cepstrum,
                                  &buffer->buffer_for_frequency_transform_)) {
      return false;
    }
  }

  // Perform Newton-Raphson method.
  double prev_epsilon(sptk::kMax);
  for (int n(0); n < num_iteration_; ++n) {
    // \tilde{c} -> c
    buffer->cepstrum_.resize(half_fft_length + 1);
    if (!inverse_frequency_transform_.Run(
            *mel_cepstrum, &buffer->cepstrum_,
            &buffer->buffer_for_inverse_frequency_transform_)) {
      return false;
    }

    // c -> \log D
    buffer->cepstrum_.resize(fft_length_, 0.0);
    if (!fourier_transform_.Run(buffer->cepstrum_, &buffer->d_,
                                &buffer->imag_part_output_,
                                &buffer->buffer_for_fourier_transform_)) {
      return false;
    }

    // \log D -> I_N / |D|^2
    std::transform(buffer->log_periodogram_.begin(),
                   buffer->log_periodogram_.end(), buffer->d_.begin(),
                   buffer->d_.begin(),
                   [](double x, double d) { return std::exp(x - d - d); });
    std::reverse_copy(buffer->d_.begin() + 1,
                      buffer->d_.begin() + half_fft_length,
                      buffer->d_.begin() + half_fft_length + 1);

    // I_N / |D|^2 -> r
    if (!inverse_fourier_transform_.Run(
            buffer->d_, &buffer->r_, &buffer->imag_part_output_,
            &buffer->buffer_for_inverse_fourier_transform_)) {
      return false;
    }

    // r -> \tilde{r}
    CoefficientsFrequencyTransform(buffer->r_, half_fft_length + 1,
                                   2 * length - 1, alpha_, &buffer->rt_,
                                   &buffer->b_);

    // Check convergence.
    // (Note that the check can be done after updating mel-cepstrum, but to
    // retain the compatibility with SPTK3, this block is written here)
    {
      const double epsilon(buffer->rt_[0]);
      const double relative_change((epsilon - prev_epsilon) / epsilon);
      if (std::fabs(relative_change) < convergence_threshold_) {
        break;
      }
      prev_epsilon = epsilon;
    }

    // \tilde{r} -> R
    std::reverse_copy(buffer->rt_.begin() + 1, buffer->rt_.begin() + length,
                      buffer->rr_.begin());
    std::copy(buffer->rt_.begin(), buffer->rt_.begin() + length,
              buffer->rr_.begin() + length - 1);

    // \tilde{r} -> \tilde{r} - a
    std::transform(buffer->rt_.begin(), buffer->rt_.begin() + length,
                   alpha_vector_.begin(), buffer->ra_.begin(),
                   std::minus<double>());

    // Compute \Delta \tilde{c}.
    if (!toeplitz_plus_hankel_system_solver_.Run(
            buffer->rr_, buffer->rt_, buffer->ra_, &buffer->gradient_,
            &buffer->buffer_for_system_solver_)) {
      return false;
    }

    // Update \tilde{c}.
    std::transform(mel_cepstrum->begin(), mel_cepstrum->end(),
                   buffer->gradient_.begin(), mel_cepstrum->begin(),
                   std::plus<double>());
  }

  return true;
}